

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O1

size_t __thiscall helics::Input::getByteCount(Input *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  size_type sVar2;
  data_view dv;
  data_view local_30;
  
  if (this->hasUpdate == false) {
    checkUpdate(this,false);
  }
  helics::ValueFederate::getBytes(&local_30,this->fed,this);
  sVar2 = local_30.dblock._M_len;
  if (local_30.dblock._M_len == 0) {
    pbVar1 = getValueRef<std::__cxx11::string>(this);
    sVar2 = pbVar1->_M_string_length;
  }
  if (local_30.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.ref.
               super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  return sVar2;
}

Assistant:

size_t Input::getByteCount()
{
    isUpdated();
    auto dv = fed->getBytes(*this);
    if (dv.empty()) {
        const auto& out = getValueRef<std::string>();
        return out.size();
    }
    return dv.size();
}